

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntDrop(Vec_Int_t *p,int i)

{
  int *piVar1;
  int iVar2;
  
  if ((-1 < i) && (i < p->nSize)) {
    iVar2 = p->nSize + -1;
    p->nSize = iVar2;
    if (i < iVar2) {
      piVar1 = p->pArray + (uint)i;
      do {
        *piVar1 = piVar1[1];
        i = i + 1;
        piVar1 = piVar1 + 1;
      } while (i < p->nSize);
    }
    return;
  }
  __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
}

Assistant:

static inline void Vec_IntDrop( Vec_Int_t * p, int i )
{
    int k;
    assert( i >= 0 && i < Vec_IntSize(p) );
    p->nSize--;
    for ( k = i; k < p->nSize; k++ )
        p->pArray[k] = p->pArray[k+1];
}